

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_ssl.cc
# Opt level: O3

long ssl_ctrl(BIO *bio,int cmd,long num,void *ptr)

{
  SSL *s;
  int iVar1;
  BIO *pBVar2;
  long lVar3;
  
  s = (SSL *)bio->ptr;
  if (cmd != 0x6d && s == (SSL *)0x0) {
    return 0;
  }
  switch(cmd) {
  case 6:
  case 7:
  case 0xc:
    lVar3 = -1;
    break;
  case 8:
    lVar3 = (long)bio->shutdown;
    break;
  case 9:
    bio->shutdown = (int)num;
    goto LAB_0023099b;
  case 10:
    iVar1 = SSL_pending(s);
    lVar3 = (long)iVar1;
    break;
  case 0xb:
    pBVar2 = SSL_get_wbio(s);
    BIO_clear_retry_flags(bio);
    lVar3 = BIO_ctrl(pBVar2,0xb,num,ptr);
    iVar1 = BIO_get_retry_flags((BIO *)pBVar2);
    BIO_set_flags((BIO *)bio,iVar1);
    iVar1 = BIO_get_retry_reason(pBVar2);
    BIO_set_retry_reason(bio,iVar1);
    break;
  case 0xd:
    pBVar2 = SSL_get_wbio(s);
    cmd = 0xd;
LAB_00230976:
    lVar3 = BIO_ctrl(pBVar2,cmd,num,ptr);
    return lVar3;
  default:
    if (cmd != 0x6d) {
      pBVar2 = SSL_get_rbio(s);
      goto LAB_00230976;
    }
    if (s != (SSL *)0x0) {
      ERR_put_error(0x10,0,0x42,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/bio_ssl.cc"
                    ,0x6b);
      return 0;
    }
    bio->shutdown = (int)num;
    bio->ptr = ptr;
    bio->init = 1;
LAB_0023099b:
    lVar3 = 1;
  }
  return lVar3;
}

Assistant:

static long ssl_ctrl(BIO *bio, int cmd, long num, void *ptr) {
  SSL *ssl = get_ssl(bio);
  if (ssl == NULL && cmd != BIO_C_SET_SSL) {
    return 0;
  }

  switch (cmd) {
    case BIO_C_SET_SSL:
      if (ssl != NULL) {
        // OpenSSL allows reusing an SSL BIO with a different SSL object. We do
        // not support this.
        OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return 0;
      }

      // Note this differs from upstream OpenSSL, which synchronizes
      // |bio->next_bio| with |ssl|'s rbio here, and on |BIO_CTRL_PUSH|. We call
      // into the corresponding |BIO| directly. (We can implement the upstream
      // behavior if it ends up necessary.)
      bio->shutdown = static_cast<int>(num);
      bio->ptr = ptr;
      bio->init = 1;
      return 1;

    case BIO_CTRL_GET_CLOSE:
      return bio->shutdown;

    case BIO_CTRL_SET_CLOSE:
      bio->shutdown = static_cast<int>(num);
      return 1;

    case BIO_CTRL_WPENDING:
      return BIO_ctrl(SSL_get_wbio(ssl), cmd, num, ptr);

    case BIO_CTRL_PENDING:
      return SSL_pending(ssl);

    case BIO_CTRL_FLUSH: {
      BIO *wbio = SSL_get_wbio(ssl);
      BIO_clear_retry_flags(bio);
      long ret = BIO_ctrl(wbio, cmd, num, ptr);
      BIO_set_flags(bio, BIO_get_retry_flags(wbio));
      BIO_set_retry_reason(bio, BIO_get_retry_reason(wbio));
      return ret;
    }

    case BIO_CTRL_PUSH:
    case BIO_CTRL_POP:
    case BIO_CTRL_DUP:
      return -1;

    default:
      return BIO_ctrl(SSL_get_rbio(ssl), cmd, num, ptr);
  }
}